

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

uint32_t nuts_be32(uint32_t in)

{
  return in >> 0x18 | (in & 0xff0000) >> 8 | (in & 0xff00) << 8 | in << 0x18;
}

Assistant:

uint32_t
nuts_be32(uint32_t in)
{
	if (is_little_endian()) {
		in = ((in >> 24u) & 0xffu) | ((in >> 8u) & 0xff00u) |
		    ((in << 8u) & 0xff0000u) | ((in << 24u) & 0xff000000u);
	}
	return (in);
}